

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolutil.cpp
# Opt level: O1

UBool utm_hasCapacity(UToolMemory *mem,int32_t capacity)

{
  int iVar1;
  void *pvVar2;
  int capacity_00;
  int iVar3;
  size_t s;
  UAlignedMemory *__src;
  UToolMemory *pUVar4;
  
  iVar3 = mem->capacity;
  if (capacity <= iVar3) {
    return (UBool)iVar3;
  }
  iVar1 = mem->maxCapacity;
  if (iVar1 < capacity) {
    pUVar4 = mem;
    utm_hasCapacity();
    iVar3 = (int)pUVar4;
  }
  else {
    if ((capacity < iVar3 * 2) && (capacity = iVar3 * 2, iVar1 / 3 < iVar3)) {
      capacity = iVar1;
    }
    __src = mem->staticArray;
    s = (long)capacity * (long)mem->size;
    if ((UAlignedMemory *)mem->array == __src) {
      pvVar2 = uprv_malloc_63(s);
      iVar3 = (int)s;
      mem->array = pvVar2;
      if (pvVar2 != (void *)0x0) {
        pvVar2 = memcpy(pvVar2,__src,(long)mem->size * (long)mem->idx);
        iVar3 = (int)__src;
      }
    }
    else {
      pvVar2 = uprv_realloc_63(mem->array,s);
      iVar3 = (int)s;
      mem->array = pvVar2;
    }
    if (mem->array != (void *)0x0) {
      mem->capacity = capacity;
      return (UBool)pvVar2;
    }
  }
  utm_hasCapacity();
  iVar1 = mem->idx;
  capacity_00 = iVar1 + iVar3;
  utm_hasCapacity(mem,capacity_00);
  mem->idx = capacity_00;
  pvVar2 = memset((void *)((long)(iVar1 * mem->size) + (long)mem->array),0,(long)(mem->size * iVar3)
                 );
  return (UBool)pvVar2;
}

Assistant:

static UBool
utm_hasCapacity(UToolMemory *mem, int32_t capacity) {
    if(mem->capacity<capacity) {
        int32_t newCapacity;

        if(mem->maxCapacity<capacity) {
            fprintf(stderr, "error: %s - trying to use more than maxCapacity=%ld units\n",
                    mem->name, (long)mem->maxCapacity);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }

        /* try to allocate a larger array */
        if(capacity>=2*mem->capacity) {
            newCapacity=capacity;
        } else if(mem->capacity<=mem->maxCapacity/3) {
            newCapacity=2*mem->capacity;
        } else {
            newCapacity=mem->maxCapacity;
        }

        if(mem->array==mem->staticArray) {
            mem->array=uprv_malloc(newCapacity*mem->size);
            if(mem->array!=NULL) {
                uprv_memcpy(mem->array, mem->staticArray, (size_t)mem->idx*mem->size);
            }
        } else {
            mem->array=uprv_realloc(mem->array, newCapacity*mem->size);
        }

        if(mem->array==NULL) {
            fprintf(stderr, "error: %s - out of memory\n", mem->name);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        mem->capacity=newCapacity;
    }

    return TRUE;
}